

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O1

int __thiscall
btGeneric6DofConstraint::get_limit_motor_info2
          (btGeneric6DofConstraint *this,btRotationalLimitMotor *limot,btTransform *transA,
          btTransform *transB,btVector3 *linVelA,btVector3 *linVelB,btVector3 *angVelA,
          btVector3 *angVelB,btConstraintInfo2 *info,int row,btVector3 *ax1,int rotational,
          int rotAllowed)

{
  float fVar1;
  int iVar2;
  btScalar *pbVar3;
  long lVar4;
  btScalar *pbVar5;
  byte bVar6;
  long lVar7;
  bool bVar8;
  float fVar9;
  btScalar bVar10;
  float fVar11;
  btScalar bVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  undefined1 local_48 [16];
  btVector3 *local_38;
  
  bVar6 = limot->m_enableMotor;
  iVar2 = limot->m_currentLimit;
  if ((iVar2 != 0 | bVar6) != 1) {
    return 0;
  }
  lVar7 = (long)(info->rowskip * row);
  bVar8 = rotational != 0;
  pbVar5 = (&info->m_J1linearAxis)[bVar8];
  pbVar3 = (&info->m_J2linearAxis)[bVar8];
  pbVar5[lVar7] = ax1->m_floats[0];
  pbVar5[lVar7 + 1] = ax1->m_floats[1];
  pbVar5[lVar7 + 2] = ax1->m_floats[2];
  pbVar3[lVar7] = -ax1->m_floats[0];
  pbVar3[lVar7 + 1] = -ax1->m_floats[1];
  pbVar3[lVar7 + 2] = -ax1->m_floats[2];
  if (!bVar8) {
    if (this->m_useOffsetForConstraintFrame == true) {
      fVar25 = ax1->m_floats[0];
      fVar19 = limot->m_currentPosition - limot->m_currentLimitError;
      fVar24 = (this->m_calculatedTransformA).m_origin.m_floats[0] - (transA->m_origin).m_floats[0];
      fVar26 = (this->m_calculatedTransformB).m_origin.m_floats[0] - (transB->m_origin).m_floats[0];
      fVar14 = (this->m_calculatedTransformA).m_origin.m_floats[1] - (transA->m_origin).m_floats[1];
      fVar15 = (this->m_calculatedTransformB).m_origin.m_floats[1] - (transB->m_origin).m_floats[1];
      fVar11 = (this->m_calculatedTransformA).m_origin.m_floats[2] - (transA->m_origin).m_floats[2];
      fVar13 = (this->m_calculatedTransformB).m_origin.m_floats[2] - (transB->m_origin).m_floats[2];
      fVar9 = this->m_factA;
      fVar1 = this->m_factB;
      fVar16 = (float)*(undefined8 *)(ax1->m_floats + 1);
      fVar17 = (float)((ulong)*(undefined8 *)(ax1->m_floats + 1) >> 0x20);
      fVar20 = fVar17 * fVar11 + fVar24 * fVar25 + fVar16 * fVar14;
      fVar22 = fVar17 * fVar13 + fVar26 * fVar25 + fVar16 * fVar15;
      fVar18 = (fVar25 * fVar19 + fVar25 * fVar20) - fVar25 * fVar22;
      fVar21 = (fVar20 * fVar16 + fVar19 * fVar16) - fVar22 * fVar16;
      fVar23 = (fVar20 * fVar17 + fVar19 * fVar17) - fVar22 * fVar17;
      fVar14 = fVar9 * fVar21 + (fVar14 - fVar20 * fVar16);
      fVar11 = fVar9 * fVar23 + (fVar11 - fVar20 * fVar17);
      fVar24 = fVar9 * fVar18 + (fVar24 - fVar25 * fVar20);
      fVar20 = (fVar26 - fVar25 * fVar22) - fVar18 * fVar1;
      fVar18 = fVar14 * fVar17 - fVar11 * fVar16;
      fVar19 = fVar11 * fVar25 - fVar24 * fVar17;
      fVar11 = fVar24 * fVar16 - fVar25 * fVar14;
      fVar14 = (fVar15 - fVar22 * fVar16) - fVar21 * fVar1;
      fVar13 = (fVar13 - fVar22 * fVar17) - fVar23 * fVar1;
      fVar15 = fVar17 * fVar14 - fVar13 * fVar16;
      fVar13 = fVar25 * fVar13 - fVar20 * fVar17;
      fVar25 = fVar20 * fVar16 - fVar14 * fVar25;
      local_48._4_4_ = fVar13;
      local_48._0_4_ = fVar15;
      local_48._8_4_ = fVar25;
      local_48._12_4_ = 0;
      if ((rotAllowed == 0) && (this->m_hasStaticBody != false)) {
        fVar18 = fVar18 * fVar9;
        fVar19 = fVar19 * fVar9;
        fVar11 = fVar9 * fVar11;
        local_48._4_4_ = fVar1 * fVar13;
        local_48._0_4_ = fVar1 * fVar15;
        local_48._8_4_ = fVar1 * fVar25;
        local_48._12_4_ = 0;
      }
      pbVar5 = info->m_J1angularAxis;
      *(ulong *)(pbVar5 + lVar7) = CONCAT44(fVar19,fVar18);
      pbVar5[lVar7 + 2] = fVar11;
      pbVar5 = info->m_J2angularAxis;
      lVar4 = 0;
      do {
        pbVar5[lVar7 + lVar4] = -*(btScalar *)(local_48 + lVar4 * 4);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 3);
    }
    else {
      fVar11 = (this->m_calculatedTransformB).m_origin.m_floats[0] - (transA->m_origin).m_floats[0];
      fVar14 = (this->m_calculatedTransformB).m_origin.m_floats[1] - (transA->m_origin).m_floats[1];
      fVar13 = (this->m_calculatedTransformB).m_origin.m_floats[2] - (transA->m_origin).m_floats[2];
      fVar25 = ax1->m_floats[2];
      fVar9 = ax1->m_floats[0];
      fVar1 = ax1->m_floats[1];
      pbVar5 = info->m_J1angularAxis;
      pbVar5[lVar7] = fVar14 * fVar25 - fVar1 * fVar13;
      pbVar5[lVar7 + 1] = fVar13 * fVar9 - fVar25 * fVar11;
      pbVar5[lVar7 + 2] = fVar11 * fVar1 - fVar14 * fVar9;
      fVar11 = (this->m_calculatedTransformB).m_origin.m_floats[0] - (transB->m_origin).m_floats[0];
      fVar13 = (this->m_calculatedTransformB).m_origin.m_floats[1] - (transB->m_origin).m_floats[1];
      fVar14 = (this->m_calculatedTransformB).m_origin.m_floats[2] - (transB->m_origin).m_floats[2];
      fVar25 = ax1->m_floats[2];
      fVar9 = ax1->m_floats[0];
      fVar1 = ax1->m_floats[1];
      pbVar5 = info->m_J2angularAxis;
      pbVar5[lVar7] = -(fVar13 * fVar25 - fVar1 * fVar14);
      pbVar5[lVar7 + 1] = -(fVar14 * fVar9 - fVar25 * fVar11);
      pbVar5[lVar7 + 2] = -(fVar11 * fVar1 - fVar13 * fVar9);
    }
  }
  if (iVar2 != 0) {
    if ((limot->m_loLimit == limot->m_hiLimit) && (!NAN(limot->m_loLimit) && !NAN(limot->m_hiLimit))
       ) {
      bVar6 = 0;
    }
  }
  info->m_constraintError[lVar7] = 0.0;
  if (bVar6 != 0) {
    info->cfm[lVar7] = limot->m_normalCFM;
    if (iVar2 != 0) goto LAB_0019506b;
    bVar12 = limot->m_targetVelocity;
    if (rotational == 0) {
      bVar12 = -bVar12;
    }
    local_38 = linVelA;
    bVar12 = btTypedConstraint::getMotorFactor
                       (&this->super_btTypedConstraint,limot->m_currentPosition,limot->m_loLimit,
                        limot->m_hiLimit,bVar12,info->fps * limot->m_stopERP);
    info->m_constraintError[lVar7] =
         bVar12 * limot->m_targetVelocity + info->m_constraintError[lVar7];
    info->m_lowerLimit[lVar7] = -limot->m_maxMotorForce;
    info->m_upperLimit[lVar7] = limot->m_maxMotorForce;
    linVelA = local_38;
  }
  if (iVar2 == 0) {
    return 1;
  }
LAB_0019506b:
  fVar25 = info->fps * limot->m_stopERP;
  if (rotational != 0) {
    fVar25 = -fVar25;
  }
  info->m_constraintError[lVar7] =
       fVar25 * limot->m_currentLimitError + info->m_constraintError[lVar7];
  info->cfm[lVar7] = limot->m_stopCFM;
  if ((limot->m_loLimit == limot->m_hiLimit) && (!NAN(limot->m_loLimit) && !NAN(limot->m_hiLimit)))
  {
    info->m_lowerLimit[lVar7] = -3.4028235e+38;
    info->m_upperLimit[lVar7] = 3.4028235e+38;
    return 1;
  }
  bVar12 = 0.0;
  if (iVar2 != 1) {
    bVar12 = -3.4028235e+38;
  }
  if (iVar2 == 1) {
    bVar10 = 3.4028235e+38;
  }
  else {
    bVar10 = 0.0;
  }
  info->m_lowerLimit[lVar7] = bVar12;
  info->m_upperLimit[lVar7] = bVar10;
  fVar25 = limot->m_bounce;
  if (0.0 < fVar25) {
    if (rotational != 0) {
      linVelB = angVelB;
      linVelA = angVelA;
    }
    fVar9 = (linVelA->m_floats[2] * ax1->m_floats[2] +
            linVelA->m_floats[0] * ax1->m_floats[0] + linVelA->m_floats[1] * ax1->m_floats[1]) -
            (ax1->m_floats[2] * linVelB->m_floats[2] +
            ax1->m_floats[0] * linVelB->m_floats[0] + ax1->m_floats[1] * linVelB->m_floats[1]);
    if (iVar2 == 1) {
      if (0.0 <= fVar9) {
        return 1;
      }
      fVar9 = fVar9 * -fVar25;
      pbVar5 = info->m_constraintError;
      if (fVar9 < pbVar5[lVar7] || fVar9 == pbVar5[lVar7]) {
        return 1;
      }
    }
    else {
      if (fVar9 <= 0.0) {
        return 1;
      }
      fVar9 = fVar9 * -fVar25;
      pbVar5 = info->m_constraintError;
      if (pbVar5[lVar7] <= fVar9) {
        return 1;
      }
    }
    pbVar5[lVar7] = fVar9;
    return 1;
  }
  return 1;
}

Assistant:

int btGeneric6DofConstraint::get_limit_motor_info2(
	btRotationalLimitMotor * limot,
	const btTransform& transA,const btTransform& transB,const btVector3& linVelA,const btVector3& linVelB,const btVector3& angVelA,const btVector3& angVelB,
	btConstraintInfo2 *info, int row, btVector3& ax1, int rotational,int rotAllowed)
{
    int srow = row * info->rowskip;
    int powered = limot->m_enableMotor;
    int limit = limot->m_currentLimit;
    if (powered || limit)
    {   // if the joint is powered, or has joint limits, add in the extra row
        btScalar *J1 = rotational ? info->m_J1angularAxis : info->m_J1linearAxis;
        btScalar *J2 = rotational ? info->m_J2angularAxis : info->m_J2linearAxis;
        J1[srow+0] = ax1[0];
        J1[srow+1] = ax1[1];
        J1[srow+2] = ax1[2];

        J2[srow+0] = -ax1[0];
        J2[srow+1] = -ax1[1];
        J2[srow+2] = -ax1[2];

		if((!rotational))
        {
			if (m_useOffsetForConstraintFrame)
			{
				btVector3 tmpA, tmpB, relA, relB;
				// get vector from bodyB to frameB in WCS
				relB = m_calculatedTransformB.getOrigin() - transB.getOrigin();
				// get its projection to constraint axis
				btVector3 projB = ax1 * relB.dot(ax1);
				// get vector directed from bodyB to constraint axis (and orthogonal to it)
				btVector3 orthoB = relB - projB;
				// same for bodyA
				relA = m_calculatedTransformA.getOrigin() - transA.getOrigin();
				btVector3 projA = ax1 * relA.dot(ax1);
				btVector3 orthoA = relA - projA;
				// get desired offset between frames A and B along constraint axis
				btScalar desiredOffs = limot->m_currentPosition - limot->m_currentLimitError;
				// desired vector from projection of center of bodyA to projection of center of bodyB to constraint axis
				btVector3 totalDist = projA + ax1 * desiredOffs - projB;
				// get offset vectors relA and relB
				relA = orthoA + totalDist * m_factA;
				relB = orthoB - totalDist * m_factB;
				tmpA = relA.cross(ax1);
				tmpB = relB.cross(ax1);
				if(m_hasStaticBody && (!rotAllowed))
				{
					tmpA *= m_factA;
					tmpB *= m_factB;
				}
				int i;
				for (i=0; i<3; i++) info->m_J1angularAxis[srow+i] = tmpA[i];
				for (i=0; i<3; i++) info->m_J2angularAxis[srow+i] = -tmpB[i];
			} else
			{
				btVector3 ltd;	// Linear Torque Decoupling vector
				btVector3 c = m_calculatedTransformB.getOrigin() - transA.getOrigin();
				ltd = c.cross(ax1);
				info->m_J1angularAxis[srow+0] = ltd[0];
				info->m_J1angularAxis[srow+1] = ltd[1];
				info->m_J1angularAxis[srow+2] = ltd[2];

				c = m_calculatedTransformB.getOrigin() - transB.getOrigin();
				ltd = -c.cross(ax1);
				info->m_J2angularAxis[srow+0] = ltd[0];
				info->m_J2angularAxis[srow+1] = ltd[1];
				info->m_J2angularAxis[srow+2] = ltd[2];
			}
        }
        // if we're limited low and high simultaneously, the joint motor is
        // ineffective
        if (limit && (limot->m_loLimit == limot->m_hiLimit)) powered = 0;
        info->m_constraintError[srow] = btScalar(0.f);
        if (powered)
        {
			info->cfm[srow] = limot->m_normalCFM;
            if(!limit)
            {
				btScalar tag_vel = rotational ? limot->m_targetVelocity : -limot->m_targetVelocity;

				btScalar mot_fact = getMotorFactor(	limot->m_currentPosition, 
													limot->m_loLimit,
													limot->m_hiLimit, 
													tag_vel, 
													info->fps * limot->m_stopERP);
				info->m_constraintError[srow] += mot_fact * limot->m_targetVelocity;
                info->m_lowerLimit[srow] = -limot->m_maxMotorForce;
                info->m_upperLimit[srow] = limot->m_maxMotorForce;
            }
        }
        if(limit)
        {
            btScalar k = info->fps * limot->m_stopERP;
			if(!rotational)
			{
				info->m_constraintError[srow] += k * limot->m_currentLimitError;
			}
			else
			{
				info->m_constraintError[srow] += -k * limot->m_currentLimitError;
			}
			info->cfm[srow] = limot->m_stopCFM;
            if (limot->m_loLimit == limot->m_hiLimit)
            {   // limited low and high simultaneously
                info->m_lowerLimit[srow] = -SIMD_INFINITY;
                info->m_upperLimit[srow] = SIMD_INFINITY;
            }
            else
            {
                if (limit == 1)
                {
                    info->m_lowerLimit[srow] = 0;
                    info->m_upperLimit[srow] = SIMD_INFINITY;
                }
                else
                {
                    info->m_lowerLimit[srow] = -SIMD_INFINITY;
                    info->m_upperLimit[srow] = 0;
                }
                // deal with bounce
                if (limot->m_bounce > 0)
                {
                    // calculate joint velocity
                    btScalar vel;
                    if (rotational)
                    {
                        vel = angVelA.dot(ax1);
//make sure that if no body -> angVelB == zero vec
//                        if (body1)
                            vel -= angVelB.dot(ax1);
                    }
                    else
                    {
                        vel = linVelA.dot(ax1);
//make sure that if no body -> angVelB == zero vec
//                        if (body1)
                            vel -= linVelB.dot(ax1);
                    }
                    // only apply bounce if the velocity is incoming, and if the
                    // resulting c[] exceeds what we already have.
                    if (limit == 1)
                    {
                        if (vel < 0)
                        {
                            btScalar newc = -limot->m_bounce* vel;
                            if (newc > info->m_constraintError[srow]) 
								info->m_constraintError[srow] = newc;
                        }
                    }
                    else
                    {
                        if (vel > 0)
                        {
                            btScalar newc = -limot->m_bounce * vel;
                            if (newc < info->m_constraintError[srow]) 
								info->m_constraintError[srow] = newc;
                        }
                    }
                }
            }
        }
        return 1;
    }
    else return 0;
}